

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QSize qvariant_cast<QSize>(QVariant *v)

{
  bool bVar1;
  QMetaType QVar2;
  QSize *pQVar3;
  QMetaType *pQVar4;
  void *pvVar5;
  long in_FS_OFFSET;
  QMetaType targetType;
  QSize t;
  QMetaType *in_stack_ffffffffffffffb8;
  QSize *in_stack_ffffffffffffffc0;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = QMetaType::fromType<QSize>();
  QVariant::Private::type((Private *)in_stack_ffffffffffffffc0);
  bVar1 = operator==((QMetaType *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    pQVar3 = QVariant::Private::get<QSize>((Private *)0xa4021f);
    local_10 = *pQVar3;
  }
  else {
    local_10 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
    QSize::QSize(in_stack_ffffffffffffffc0);
    pQVar4 = (QMetaType *)QVariant::metaType();
    pvVar5 = QVariant::constData((QVariant *)0xa40258);
    QMetaType::convert(pQVar4,pvVar5,(QMetaType *)QVar2.d_ptr,&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}